

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

int __thiscall
libcellml::Model::clone(Model *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Entity *this_00;
  NamedEntity *this_01;
  ComponentEntity *pCVar1;
  Model *this_02;
  size_t sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int __flags_00;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t index;
  ulong uVar6;
  UnitsPtr UVar7;
  ComponentPtr CVar8;
  IndexStack indexStack;
  EquivalenceMap map;
  ComponentPtr c;
  Model local_98;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  element_type *local_58;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  ComponentEntity local_40;
  
  create();
  this_00 = (Entity *)
            (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity;
  Entity::id_abi_cxx11_((string *)local_78,(Entity *)__fn);
  Entity::setId(this_00,(string *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  this_01 = (NamedEntity *)
            (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity;
  NamedEntity::name_abi_cxx11_((string *)local_78,(NamedEntity *)__fn);
  NamedEntity::setName(this_01,(string *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  pCVar1 = (ComponentEntity *)
           (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
  ComponentEntity::encapsulationId_abi_cxx11_((string *)local_78,(ComponentEntity *)__fn);
  ComponentEntity::setEncapsulationId(pCVar1,(string *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  uVar4 = *(ulong *)(*(long *)(__fn + 8) + 0x90);
  if (uVar4 != *(ulong *)(*(long *)(__fn + 8) + 0x88)) {
    uVar6 = 0;
    do {
      __flags_00 = (int)uVar4;
      this_02 = (Model *)(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                         super_Entity._vptr_Entity;
      UVar7 = units(&local_98,(size_t)__fn);
      Units::clone((Units *)local_78,
                   (__fn *)local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                           super_Entity._vptr_Entity,
                   UVar7.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi,__flags_00,__arg);
      addUnits(this_02,(UnitsPtr *)local_78);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_78._12_4_,local_78._8_4_)
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_78._12_4_,local_78._8_4_));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                   super_Entity.mPimpl);
      }
      uVar6 = uVar6 + 1;
      uVar4 = *(long *)(*(long *)(__fn + 8) + 0x90) - *(long *)(*(long *)(__fn + 8) + 0x88) >> 4;
    } while (uVar6 < uVar4);
  }
  uVar6 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount((ComponentEntity *)__fn);
    if (sVar2 <= uVar6) break;
    pCVar1 = (ComponentEntity *)
             (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
    CVar8 = ComponentEntity::component(&local_98.super_ComponentEntity,(size_t)__fn);
    Component::clone((Component *)local_78,
                     (__fn *)local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                             super_Entity._vptr_Entity,
                     CVar8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi,(int)uVar4,__arg);
    ComponentEntity::addComponent(pCVar1,(ComponentPtr *)local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_78._12_4_,local_78._8_4_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_78._12_4_,local_78._8_4_));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl);
    }
    uVar6 = uVar6 + 1;
  }
  uVar4 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount
                      ((ComponentEntity *)
                       (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity);
    if (sVar2 <= uVar4) break;
    ComponentEntity::component
              ((ComponentEntity *)local_78,
               (size_t)(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity);
    fixComponentUnits((ModelPtr *)this,(ComponentPtr *)local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_78._12_4_,local_78._8_4_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_78._12_4_,local_78._8_4_));
    }
    uVar4 = uVar4 + 1;
  }
  local_68._8_8_ = local_78 + 8;
  local_78._8_4_ = _S_red;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68._M_allocated_capacity = 0;
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)0x0;
  local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
       (EntityImpl *)0x0;
  local_58 = (element_type *)local_68._8_8_;
  while( true ) {
    local_48._M_pi = p_Var5;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ComponentEntity::componentCount((ComponentEntity *)__fn);
    if (p_Var3 <= p_Var5) break;
    if ((element_type *)
        local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl ==
        local_98.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
        super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,
                 (iterator)
                 local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl,(unsigned_long *)&local_48);
    }
    else {
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
           local_48._M_pi;
      local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
           (EntityImpl *)
           ((long)local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity
                  .mPimpl + 8);
    }
    ComponentEntity::component(&local_40,(size_t)__fn);
    recordVariableEquivalences
              ((ComponentPtr *)&local_40,(EquivalenceMap *)local_78,(IndexStack *)&local_98);
    generateEquivalenceMap
              ((ComponentPtr *)&local_40,(EquivalenceMap *)local_78,(IndexStack *)&local_98);
    local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
         (EntityImpl *)
         ((long)&local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl[-1].mId.field_2 + 8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(local_48._M_pi)->_vptr__Sp_counted_base + 1);
  }
  applyEquivalenceMapToModel((EquivalenceMap *)local_78,(ModelPtr *)this);
  if (local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
      _vptr_Entity != (_func_int **)0x0) {
    operator_delete(local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                    super_Entity._vptr_Entity,
                    (long)local_98.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
                          super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                    (long)local_98.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                          super_Entity._vptr_Entity);
  }
  std::
  _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
               *)local_78);
  return (int)this;
}

Assistant:

ModelPtr Model::clone() const
{
    auto m = create();

    m->setId(id());
    m->setName(name());

    m->setEncapsulationId(encapsulationId());

    for (size_t index = 0; index < pFunc()->mUnits.size(); ++index) {
        m->addUnits(units(index)->clone());
    }

    for (size_t index = 0; index < componentCount(); ++index) {
        m->addComponent(component(index)->clone());
    }

    for (size_t index = 0; index < m->componentCount(); ++index) {
        fixComponentUnits(m, m->component(index));
    }

    // Generate equivalence map starting from the models components.
    EquivalenceMap map;
    IndexStack indexStack;
    for (size_t index = 0; index < componentCount(); ++index) {
        indexStack.push_back(index);
        auto c = component(index);
        recordVariableEquivalences(c, map, indexStack);
        generateEquivalenceMap(c, map, indexStack);
        indexStack.pop_back();
    }
    applyEquivalenceMapToModel(map, m);

    return m;
}